

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<5,_2,_3>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  long lVar2;
  VecAccess<float,_4,_3> *pVVar3;
  Matrix<float,_3,_2> *extraout_RDX;
  Matrix<float,_3,_2> *mat;
  long lVar4;
  VecAccess<float,_4,_3> *this;
  Matrix<float,_3,_2> retVal;
  Vector<float,_2> local_78;
  Vector<float,_3> local_70;
  VecAccess<float,_4,_3> local_60;
  Vector<float,_3> local_48;
  Matrix<float,_2,_3> local_38;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    local_78.m_data = *(float (*) [2])(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_2>::Vector
              (&local_78,(Vector<float,_2> *)sr::(anonymous_namespace)::s_constInVec2);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    local_70.m_data[2] = (evalCtx->coords).m_data[2];
    local_70.m_data._0_8_ = *(undefined8 *)(evalCtx->coords).m_data;
  }
  else {
    tcu::Vector<float,_3>::Vector
              (&local_70,(Vector<float,_3> *)(sr::(anonymous_namespace)::s_constInVec3 + 0xc));
  }
  this = &local_60;
  tcu::Matrix<float,_3,_2>::Matrix((Matrix<float,_3,_2> *)this);
  mat = extraout_RDX;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar1 = local_70.m_data[lVar2];
    pVVar3 = this;
    for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
      ((Vector<tcu::Vector<float,_3>,_2> *)&pVVar3->m_vector)->m_data[0].m_data[0] =
           local_78.m_data[lVar4] * fVar1;
      pVVar3 = (VecAccess<float,_4,_3> *)(pVVar3->m_index + 1);
    }
    this = (VecAccess<float,_4,_3> *)
           (((Vector<tcu::Vector<float,_3>,_2> *)&this->m_vector)->m_data[0].m_data + 1);
    mat = (Matrix<float,_3,_2> *)0x2;
  }
  tcu::transpose<float,3,2>(&local_38,(tcu *)&local_60,mat);
  local_48.m_data[2] = local_38.m_data.m_data[2].m_data[0] + local_38.m_data.m_data[2].m_data[1];
  local_48.m_data[0] = local_38.m_data.m_data[0].m_data[0] + local_38.m_data.m_data[0].m_data[1];
  local_48.m_data[1] = local_38.m_data.m_data[1].m_data[1] + local_38.m_data.m_data[1].m_data[0];
  local_60.m_vector = &evalCtx->color;
  local_60.m_index[0] = 0;
  local_60.m_index[1] = 1;
  local_60.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_60,&local_48);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(outerProduct(in0, in1));
	}